

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setGeometry(ToolBarLayout *this)

{
  QRect *in_RSI;
  
  setGeometry((ToolBarLayout *)&this[-1].orient,in_RSI);
  return;
}

Assistant:

void
ToolBarLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int x = r.x();
	int y = r.y();

	if( !buttons.isEmpty() && left && right )
	{
		if( offset < 0 )
			offset = 0;

		QSize leftSize = left->sizeHint();
		const QSize rightSize = right->sizeHint();

		if( orient == Qt::Horizontal )
			y = r.y() + ( r.height() - leftSize.height() ) / 2;
		else
			x = r.x() + ( r.width() - leftSize.width() ) / 2;

		// Set left arrow geometry.
		bool leftArrowShown = false;

		if( offset > 0 )
		{
			leftArrowShown = true;

			left->setGeometry( QRect( x, y, leftSize.width(), leftSize.height() ) );

			if( orient == Qt::Horizontal )
				x += leftSize.width() + spacing();
			else
				y += leftSize.height() + spacing();
		}
		else
		{
			left->setGeometry( QRect( 0, 0, 0, 0 ) );
			leftSize = QSize( 0, 0 );

			x = r.x();
			y = r.y();
		}

		const QSize buttonSize = buttons.at( 0 )->sizeHint();
		const int dim = ( orient == Qt::Horizontal ?
			buttonSize.width() : buttonSize.height() ) + spacing();
		int i = 0;
		int tmpOffset = offset;

		// Hide buttons that left on left arrow.
		while( tmpOffset >= dim )
		{
			buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );

			++i;
			tmpOffset -= dim;
		}

		int stop = 0;

		// Show visible buttons.
		if( orient == Qt::Horizontal )
		{
			x += offset % dim;
			tmpOffset = x;
			stop = ( r.width() - leftSize.width() ) / dim * dim;
			y = r.y() + ( r.height() - buttonSize.height() ) / 2;
		}
		else
		{
			y += offset % dim;
			tmpOffset = y;
			stop = ( r.height() - leftSize.height() ) / dim * dim;
			x = r.x() + ( r.width() - buttonSize.width() ) / 2;
		}

		int space = spaceNeeded();

		if( space < ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			if( ( ( align & Qt::AlignRight ) && orient == Qt::Horizontal )
				| ( ( align & Qt::AlignBottom ) && orient == Qt::Vertical  ) )
			{
				if( orient == Qt::Horizontal )
					x += r.width() - space;
				else
					y += r.height() - space;
			}
			else if( align & Qt::AlignCenter )
			{
				if( orient == Qt::Horizontal )
					x += ( r.width() - space ) / 2;
				else
					y += ( r.height() - space ) / 2;
			}
		}

		space = 0;

		while( tmpOffset < stop && i < buttons.size() )
		{
			buttons.at( i )->setGeometry( QRect( x, y,
				buttonSize.width(), buttonSize.height() ) );

			if( orient == Qt::Horizontal )
			{
				x += dim;
				space = x;
			}
			else
			{
				y += dim;
				space = y;
			}

			tmpOffset += dim;
			++i;
		}

		// Set right arrow geometry.
		bool rightArrowShown = false;

		if( i < buttons.size() )
		{
			if( orient == Qt::Horizontal )
			{
				x = r.width() - rightSize.width() + r.x();
				y = r.y() + ( r.height() - rightSize.height() ) / 2;

				if( tmpOffset > r.width() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}
			else
			{
				x = r.x() + ( r.width() - rightSize.width() ) / 2;
				y = r.height() - rightSize.height() + r.y();

				if( tmpOffset > r.height() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}

			right->setGeometry( QRect( x, y,
				rightSize.width(), rightSize.height() ) );

			right->widget()->raise();

			rightArrowShown = true;
		}
		else
		{
			right->setGeometry( QRect( 0, 0, 0, 0 ) );
		}

		// Hide buttons that right on right arrow.
		if( i < buttons.size() )
		{
			for( ; i < buttons.size(); ++i )
				buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );
		}
		else if( offset > 0 && leftArrowShown &&
			!rightArrowShown &&
			space + dim / 2 <= ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			offset = 0;
			setGeometry( rect );
		}

		left->widget()->raise();
	}
}